

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_30c12::createDFDCompressedTest1x16_FormatASTC_10x8_Test::
createDFDCompressedTest1x16_FormatASTC_10x8_Test
          (createDFDCompressedTest1x16_FormatASTC_10x8_Test *this)

{
  createDFDCompressedTest1x16 *in_RDI;
  
  createDFDCompressedTest1x16::createDFDCompressedTest1x16(in_RDI);
  (in_RDI->super_createDFDTestBaseComp<1U,_16U>).super_createDFDTestBase<1U,_16U>.super_Test.
  _vptr_Test = (_func_int **)&PTR__createDFDCompressedTest1x16_FormatASTC_10x8_Test_00218968;
  return;
}

Assistant:

TEST_F(createDFDCompressedTest1x16, FormatASTC_10x8) {
    customize(KHR_DF_MODEL_ASTC, KHR_DF_PRIMARIES_BT709,
              KHR_DF_TRANSFER_LINEAR, KHR_DF_FLAG_ALPHA_STRAIGHT,
              9, 7,
              {
                {0, 127, KHR_DF_CHANNEL_ASTC_DATA, 0, 0, 0, 0, 0, 0xFFFFFFFF},
              }
             );

    uint32_t* dfd = createDFDCompressed(c_ASTC, 10, 8, 1, s_UNORM);

    EXPECT_EQ(*dfd, sizeof(expected) + 4U);
    EXPECT_EQ(memcmp(&expected, dfd+1, sizeof(expected)), 0);

    free(dfd);
}